

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall smf::MidiMessage::getSpelling(MidiMessage *this,int *base7,int *accidental)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  bVar2 = isNoteOn(this);
  if (!bVar2) {
    return;
  }
  *base7 = -0x1e240;
  *accidental = 0x1e240;
  uVar3 = getKeyNumber(this);
  uVar1 = (int)((uint)(ushort)((short)uVar3 >> 0xf) << 0x10 | uVar3 & 0xffff) / 0xc;
  uVar6 = uVar1 & 0xffff;
  uVar3 = (uVar1 & 0xffff) * -0xc + uVar3;
  uVar4 = getVelocity(this);
  iVar5 = 0;
  if (0xb < uVar3) goto LAB_001126d0;
  uVar4 = uVar4 & 3;
  switch(uVar3) {
  case 0:
    switch(uVar4) {
    default:
      *accidental = 0;
      goto LAB_001126d0;
    case 1:
      *accidental = -2;
      break;
    case 3:
      *accidental = 1;
LAB_0011267f:
      uVar6 = (uVar1 & 0xffff) - 1;
      goto LAB_00112681;
    }
    break;
  case 1:
    switch(uVar4) {
    default:
      *accidental = 1;
      goto LAB_001126d0;
    case 1:
      *accidental = -1;
      break;
    case 3:
      *accidental = 2;
      goto LAB_0011267f;
    }
    break;
  case 2:
    switch(uVar4) {
    default:
      *accidental = 0;
      break;
    case 1:
      *accidental = -2;
LAB_001126b7:
      iVar5 = 2;
      goto LAB_001126d0;
    case 3:
      *accidental = 2;
      goto LAB_001126d0;
    }
    break;
  case 3:
    switch(uVar4) {
    default:
      *accidental = -1;
      goto LAB_001126b7;
    case 1:
      *accidental = -2;
      goto LAB_001126cd;
    case 3:
      *accidental = 1;
    }
    break;
  case 4:
    switch(uVar4) {
    default:
      *accidental = 0;
      goto LAB_001126b7;
    case 1:
      *accidental = -1;
      goto LAB_001126cd;
    case 3:
      *accidental = 2;
    }
    break;
  case 5:
    switch(uVar4) {
    default:
      *accidental = 0;
      break;
    case 1:
      *accidental = -2;
LAB_00112692:
      iVar5 = 4;
      goto LAB_001126d0;
    case 3:
      *accidental = 1;
      goto LAB_001126b7;
    }
    goto LAB_001126cd;
  case 6:
    switch(uVar4) {
    default:
      *accidental = 1;
      break;
    case 1:
      *accidental = -1;
      goto LAB_00112692;
    case 3:
      *accidental = 2;
      goto LAB_001126b7;
    }
    goto LAB_001126cd;
  case 7:
    switch(uVar4) {
    default:
      *accidental = 0;
      goto LAB_00112692;
    case 1:
      *accidental = -2;
LAB_001126c2:
      iVar5 = 5;
      goto LAB_001126d0;
    case 3:
      *accidental = 2;
    }
    goto LAB_001126cd;
  case 8:
    switch(uVar4) {
    default:
      *accidental = 1;
      goto LAB_00112692;
    case 1:
      *accidental = -1;
      goto LAB_001126c2;
    case 3:
      *accidental = 3;
    }
LAB_001126cd:
    iVar5 = 3;
    goto LAB_001126d0;
  case 9:
    switch(uVar4) {
    default:
      *accidental = 0;
      goto LAB_001126c2;
    case 1:
      *accidental = -2;
      break;
    case 3:
      *accidental = 2;
      goto LAB_00112692;
    }
    goto LAB_00112681;
  case 10:
    switch(uVar4) {
    default:
      *accidental = -1;
      break;
    case 1:
      *accidental = -2;
LAB_0011269d:
      uVar6 = (uVar1 & 0xffff) + 1;
      goto LAB_001126d0;
    case 3:
      *accidental = 1;
      goto LAB_001126c2;
    }
    goto LAB_00112681;
  case 0xb:
    switch(uVar4) {
    default:
      *accidental = 0;
      break;
    case 1:
      *accidental = -1;
      goto LAB_0011269d;
    case 3:
      *accidental = 2;
      goto LAB_001126c2;
    }
LAB_00112681:
    iVar5 = 6;
    goto LAB_001126d0;
  }
  iVar5 = 1;
LAB_001126d0:
  *base7 = uVar6 * 7 + iVar5;
  return;
}

Assistant:

void MidiMessage::getSpelling(int& base7, int& accidental) {
	if (!isNoteOn()) {
		return;
	}
	base7 = -123456;
	accidental = 123456;
	int base12   = getKeyNumber();
	int octave   = base12 / 12;
	int base12pc = base12 - octave * 12;
	int base7pc  = 0;
	int spelling = 0x03 & getVelocity();

	// Table 5.1, page 101 in Beyond MIDI (1997)
	// http://beyondmidi.ccarh.org/beyondmidi-600dpi.pdf
	switch (base12pc) {

		case 0:
			switch (spelling) {
				        case 1: base7pc = 1; accidental = -2; break;  // Dbb
				case 0: case 2: base7pc = 0; accidental =  0; break;  // C
				        case 3: base7pc = 6; accidental = +1; octave--; break;  // B#
			}
			break;

		case 1:
			switch (spelling) {
				        case 1: base7pc = 1; accidental = -1; break;  // Db
				case 0: case 2: base7pc = 0; accidental = +1; break;  // C#
				        case 3: base7pc = 6; accidental = +2; octave--; break;  // B##
			}
			break;

		case 2:
			switch (spelling) {
				        case 1: base7pc = 2; accidental = -2; break;  // Ebb
				case 0: case 2: base7pc = 1; accidental =  0; break;  // D
				        case 3: base7pc = 0; accidental = +2; break;  // C##
			}
			break;

		case 3:
			switch (spelling) {
				        case 1: base7pc = 3; accidental = -2; break;  // Fbb
				case 0: case 2: base7pc = 2; accidental = -1; break;  // Eb
				        case 3: base7pc = 1; accidental = +1; break;  // D#
			}
			break;

		case 4:
			switch (spelling) {
				        case 1: base7pc = 3; accidental = -1; break;  // Fb
				case 0: case 2: base7pc = 2; accidental =  0; break;  // E
				        case 3: base7pc = 1; accidental = +2; break;  // D##
			}
			break;

		case 5:
			switch (spelling) {
				        case 1: base7pc = 4; accidental = -2; break;  // Gbb
				case 0: case 2: base7pc = 3; accidental =  0; break;  // F
				        case 3: base7pc = 2; accidental = +1; break;  // E#
			}
			break;

		case 6:
			switch (spelling) {
				        case 1: base7pc = 4; accidental = -1; break;  // Gb
				case 0: case 2: base7pc = 3; accidental = +1; break;  // F#
				        case 3: base7pc = 2; accidental = +2; break;  // E##
			}
			break;

		case 7:
			switch (spelling) {
				        case 1: base7pc = 5; accidental = -2; break;  // Abb
				case 0: case 2: base7pc = 4; accidental =  0; break;  // G
				        case 3: base7pc = 3; accidental = +2; break;  // F##
			}
			break;

		case 8:
			switch (spelling) {
				        case 1: base7pc = 5; accidental = -1; break;  // Ab
				case 0: case 2: base7pc = 4; accidental = +1; break;  // G#
				        case 3: base7pc = 3; accidental = +3; break;  // F###
			}
			break;

		case 9:
			switch (spelling) {
				        case 1: base7pc = 6; accidental = -2; break;  // Bbb
				case 0: case 2: base7pc = 5; accidental =  0; break;  // A
				        case 3: base7pc = 4; accidental = +2; break;  // G##
			}
			break;

		case 10:
			switch (spelling) {
				        case 1: base7pc = 0; accidental = -2; octave++; break;  // Cbb
				case 0: case 2: base7pc = 6; accidental = -1; break;  // Bb
				        case 3: base7pc = 5; accidental = +1; break;  // A#
			}
			break;

		case 11:
			switch (spelling) {
				        case 1: base7pc = 0; accidental = -1; octave++; break;  // Cb
				case 0: case 2: base7pc = 6; accidental =  0; break;  // B
				        case 3: base7pc = 5; accidental = +2; break;  // A##
			}
			break;

	}

	base7 = base7pc + 7 * octave;
}